

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O0

int Vec_IntCountNonTrivial(Vec_Ptr_t *vEquivs,int *pnUsed)

{
  int iVar1;
  Vec_Int_t *p;
  undefined4 local_28;
  undefined4 local_24;
  int nClasses;
  int i;
  Vec_Int_t *vClass;
  int *pnUsed_local;
  Vec_Ptr_t *vEquivs_local;
  
  local_28 = 0;
  *pnUsed = 0;
  for (local_24 = 0; iVar1 = Vec_PtrSize(vEquivs), local_24 < iVar1; local_24 = local_24 + 1) {
    p = (Vec_Int_t *)Vec_PtrEntry(vEquivs,local_24);
    iVar1 = Vec_IntSize(p);
    if (1 < iVar1) {
      local_28 = local_28 + 1;
      iVar1 = Vec_IntSize(p);
      *pnUsed = iVar1 + *pnUsed;
    }
  }
  return local_28;
}

Assistant:

int Vec_IntCountNonTrivial( Vec_Ptr_t * vEquivs, int * pnUsed )
{
    Vec_Int_t * vClass;
    int i, nClasses = 0;
    *pnUsed = 0;
    Vec_PtrForEachEntry( Vec_Int_t *, vEquivs, vClass, i )
    {
        if ( Vec_IntSize(vClass) < 2 )
            continue;
        nClasses++;
        (*pnUsed) += Vec_IntSize(vClass);
    }
    return nClasses;
}